

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_wraith.cpp
# Opt level: O3

int AF_A_WraithFX3(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  double dVar3;
  PClass *pPVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  PClass *pPVar9;
  PClassActor *type;
  AActor *pAVar10;
  AActor *pAVar11;
  VMValue *pVVar12;
  char *__assertion;
  bool bVar13;
  bool bVar14;
  DVector2 v;
  FName local_64;
  double local_60;
  double local_58;
  double local_50;
  DVector3 local_48;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005ec7ce;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    pAVar11 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (pAVar11 == (AActor *)0x0) {
LAB_005ec5af:
        pAVar11 = (AActor *)0x0;
        pVVar12 = param;
        uVar7 = numparam;
      }
      else {
        pPVar9 = (pAVar11->super_DThinker).super_DObject.Class;
        if (pPVar9 == (PClass *)0x0) {
          iVar6 = (**(pAVar11->super_DThinker).super_DObject._vptr_DObject)(pAVar11);
          pPVar9 = (PClass *)CONCAT44(extraout_var,iVar6);
          (pAVar11->super_DThinker).super_DObject.Class = pPVar9;
        }
        bVar13 = pPVar9 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar13;
        bVar14 = pPVar9 == pPVar4;
        if (!bVar14 && !bVar13) {
          do {
            pPVar9 = pPVar9->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar9 != (PClass *)0x0);
            if (pPVar9 == pPVar4) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        pVVar12 = (VMValue *)(ulong)(bVar14 || bVar13);
        uVar7 = (uint)bVar13;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005ec7ce;
        }
      }
      pPVar4 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005ec66f;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005ec7be;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar9 = (PClass *)puVar2[1];
            if (pPVar9 == (PClass *)0x0) {
              pPVar9 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar12,uVar7,ret);
              puVar2[1] = pPVar9;
            }
            bVar13 = pPVar9 != (PClass *)0x0;
            if (pPVar9 != pPVar4 && bVar13) {
              do {
                pPVar9 = pPVar9->ParentClass;
                bVar13 = pPVar9 != (PClass *)0x0;
                if (pPVar9 == pPVar4) break;
              } while (pPVar9 != (PClass *)0x0);
            }
            if (!bVar13) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005ec7ce;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005ec7be;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005ec66f:
        uVar7 = FRandom::GenRand32(&pr_wraithfx3);
        bVar5 = (char)uVar7 + (char)((uVar7 & 0xff) / 0xf) * -0xf;
        if (bVar5 != 0) {
          uVar7 = bVar5 + 1;
          do {
            uVar8 = FRandom::GenRand32(&pr_wraithfx3);
            local_50 = (double)(int)((uVar8 & 0xff) - 0x80) * 0.03125;
            uVar8 = FRandom::GenRand32(&pr_wraithfx3);
            local_58 = (double)(int)((uVar8 & 0xff) - 0x80) * 0.03125;
            uVar8 = FRandom::GenRand32(&pr_wraithfx3);
            local_60 = (double)(uVar8 & 0xff) * 0.015625;
            iVar6 = FName::NameManager::FindName(&FName::NameData,"WraithFX3",false);
            P_GetOffsetPosition((pAVar11->__Pos).X,(pAVar11->__Pos).Y,local_50,local_58);
            local_48.Z = local_60 + (pAVar11->__Pos).Z;
            local_64.Index = iVar6;
            type = ClassForSpawn(&local_64);
            pAVar10 = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
            if (pAVar10 != (AActor *)0x0) {
              dVar3 = pAVar11->ceilingz;
              pAVar10->floorz = pAVar11->floorz;
              pAVar10->ceilingz = dVar3;
              (pAVar10->target).field_0.p = pAVar11;
            }
            uVar7 = uVar7 - 1;
          } while (1 < uVar7);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005ec7ce;
    }
    if (pAVar11 == (AActor *)0x0) goto LAB_005ec5af;
  }
LAB_005ec7be:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005ec7ce:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                ,0x96,"int AF_A_WraithFX3(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WraithFX3)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	int numdropped = pr_wraithfx3() % 15;

	while (numdropped-- > 0)
	{
		double xo = (pr_wraithfx3() - 128) / 32.;
		double yo = (pr_wraithfx3() - 128) / 32.;
		double zo = pr_wraithfx3() / 64.;

		mo = Spawn("WraithFX3", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->floorz = self->floorz;
			mo->ceilingz = self->ceilingz;
			mo->target = self;
		}
	}
	return 0;
}